

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_NestedMessage_Test::TestBody
          (ParseMessageTest_NestedMessage_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "message TestMessage {\n  message Nested {}\n  optional Nested test_nested = 1;\n}\n",
             "message_type {  name: \"TestMessage\"  nested_type {     name: \"Nested\"  }  field { name:\"test_nested\" label:LABEL_OPTIONAL number:1          type_name: \"Nested\" }}"
            );
  return;
}

Assistant:

TEST_F(ParseMessageTest, NestedMessage) {
  ExpectParsesTo(
      "message TestMessage {\n"
      "  message Nested {}\n"
      "  optional Nested test_nested = 1;\n"
      "}\n",

      "message_type {"
      "  name: \"TestMessage\""
      "  nested_type { "
      "    name: \"Nested\""
      "  }"
      "  field { name:\"test_nested\" label:LABEL_OPTIONAL number:1"
      "          type_name: \"Nested\" }"
      "}");
}